

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::end_object(t_json_generator *this)

{
  ostream *poVar1;
  string local_30;
  t_json_generator *local_10;
  t_json_generator *this_local;
  
  local_10 = this;
  t_generator::indent_down(&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_json_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_30,&this->super_t_generator);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string((string *)&local_30);
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::pop(&this->comma_needed_);
  return;
}

Assistant:

void t_json_generator::end_object() {
  indent_down();
  f_json_ << endl << indent() << "}";
  comma_needed_.pop();
}